

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O3

char * ctemplate_htmlparser::htmlparser_value(htmlparser_ctx *ctx)

{
  int iVar1;
  char *__src;
  char *__dest;
  
  iVar1 = statemachine_get_state(ctx->statemachine);
  if ((iVar1 == 0x7f) || (5 < (long)iVar1 - 0xfU)) {
    __dest = (char *)0x0;
  }
  else {
    __dest = ctx->value;
    __src = statemachine_record_buffer(ctx->statemachine);
    strncpy(__dest,__src,0x100);
    ctx->value[0xff] = '\0';
  }
  return __dest;
}

Assistant:

const char *htmlparser_value(htmlparser_ctx *ctx)
{
  int ext_state = state_external(statemachine_get_state(ctx->statemachine));
  if (ext_state == HTMLPARSER_STATE_VALUE) {
    strncpy(ctx->value, statemachine_record_buffer(ctx->statemachine),
            HTMLPARSER_MAX_STRING);
    ctx->value[HTMLPARSER_MAX_STRING - 1] = '\0';
    return ctx->value;
  } else {
    return NULL;
  }
}